

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

void __thiscall Alice::LoadNextRandomPermutation(Alice *this)

{
  int iVar1;
  value_type_conflict1 local_38;
  int local_34;
  value_type_conflict1 local_30;
  int j;
  long lStack_28;
  int i;
  long temp;
  Alice *local_10;
  Alice *this_local;
  
  local_10 = this;
  if (LoadNextRandomPermutation()::pin == '\0') {
    iVar1 = __cxa_guard_acquire(&LoadNextRandomPermutation()::pin);
    if (iVar1 != 0) {
      std::ifstream::ifstream
                (LoadNextRandomPermutation()::pin,"../randoms/alice/Permutations_PA.txt",8);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextRandomPermutation()::pin,&__dso_handle);
      __cxa_guard_release(&LoadNextRandomPermutation()::pin);
    }
  }
  if (LoadNextRandomPermutation()::din == '\0') {
    iVar1 = __cxa_guard_acquire(&LoadNextRandomPermutation()::din);
    if (iVar1 != 0) {
      std::ifstream::ifstream
                (LoadNextRandomPermutation()::din,"../randoms/alice/Permutations_DA.txt",8);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextRandomPermutation()::din,&__dso_handle);
      __cxa_guard_release(&LoadNextRandomPermutation()::din);
    }
  }
  std::vector<int,_std::allocator<int>_>::clear(&(this->super_Party).Pi_P);
  std::vector<int,_std::allocator<int>_>::clear(&(this->super_Party).Pi_D);
  for (j = 0; j < (this->super_Party).n_p; j = j + 1) {
    std::istream::operator>>((istream *)LoadNextRandomPermutation()::pin,&stack0xffffffffffffffd8);
    local_30 = (value_type_conflict1)lStack_28;
    std::vector<int,_std::allocator<int>_>::push_back(&(this->super_Party).Pi_P,&local_30);
  }
  for (local_34 = 0; local_34 < (this->super_Party).n_d; local_34 = local_34 + 1) {
    std::istream::operator>>((istream *)LoadNextRandomPermutation()::din,&stack0xffffffffffffffd8);
    local_38 = (value_type_conflict1)lStack_28;
    std::vector<int,_std::allocator<int>_>::push_back(&(this->super_Party).Pi_D,&local_38);
  }
  return;
}

Assistant:

void Alice::LoadNextRandomPermutation()
{
    static std::ifstream pin("../randoms/alice/Permutations_PA.txt");
    static std::ifstream din("../randoms/alice/Permutations_DA.txt");
    long temp;
    Pi_P.clear();
    Pi_D.clear();
    for(int i=0; i < n_p; i++)
    {
        pin>>temp;
        Pi_P.push_back(temp);
    }
    for(int j=0; j < n_d; j++)
    {
        din>>temp;
        Pi_D.push_back(temp);
    }   
}